

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open_trace_file.c
# Opt level: O1

char * tokenise_search_path(char *searchpath)

{
  int iVar1;
  char cVar2;
  int iVar3;
  uint uVar4;
  size_t sVar5;
  char *pcVar6;
  uint uVar8;
  ulong uVar9;
  int iVar10;
  uint uVar11;
  char *__s1;
  char *__s;
  ulong uVar7;
  
  __s = "";
  if (searchpath != (char *)0x0) {
    __s = searchpath;
  }
  sVar5 = strlen(__s);
  pcVar6 = (char *)malloc(sVar5 + 5);
  uVar11 = 0;
  if (pcVar6 == (char *)0x0) {
    pcVar6 = (char *)0x0;
  }
  else {
    if (sVar5 != 0) {
      uVar7 = 0;
      uVar11 = 0;
      do {
        iVar3 = (int)uVar7;
        if ((uVar7 < sVar5 - 1) && (__s[uVar7] == ':')) {
          uVar8 = iVar3 + 1;
          cVar2 = ':';
          if (__s[uVar8] != ':') goto LAB_0012ff81;
LAB_001300f7:
          uVar7 = (ulong)uVar11;
          uVar11 = uVar11 + 1;
          pcVar6[uVar7] = cVar2;
        }
        else {
LAB_0012ff81:
          if ((iVar3 == 0) || (__s[iVar3 - 1] == ':')) {
            __s1 = __s + uVar7;
            iVar3 = strncmp(__s1,"http:",5);
            if ((iVar3 == 0) ||
               ((((iVar3 = strncmp(__s1,"ftp:",4), iVar3 == 0 ||
                  (iVar3 = strncmp(__s1,"|http:",6), iVar3 == 0)) ||
                 (iVar3 = strncmp(__s1,"|ftp:",5), iVar3 == 0)) ||
                ((iVar3 = strncmp(__s1,"URL=http:",9), iVar3 == 0 ||
                 (iVar3 = strncmp(__s1,"URL=ftp:",8), iVar3 == 0)))))) {
              do {
                uVar8 = uVar11;
                cVar2 = __s[uVar7];
                pcVar6[uVar8] = cVar2;
                if (sVar5 <= uVar7) break;
                uVar7 = (ulong)((int)uVar7 + 1);
                uVar11 = uVar8 + 1;
              } while (cVar2 != ':');
              uVar4 = (uint)(__s[uVar7] == ':') + (int)uVar7;
              uVar7 = (ulong)uVar4;
              uVar11 = uVar8 + 1;
              if (__s[uVar7] == '/') {
                uVar7 = (ulong)(uVar4 + 1);
                uVar11 = uVar8 + 2;
                pcVar6[uVar8 + 1] = '/';
              }
              uVar9 = (ulong)uVar11;
              iVar3 = (int)uVar7;
              if (__s[uVar7] == '/') {
                iVar3 = iVar3 + 1;
                uVar11 = uVar11 + 1;
                pcVar6[uVar9] = '/';
              }
              iVar1 = 0;
              do {
                iVar10 = iVar1;
                uVar7 = (ulong)(iVar3 + iVar10 + 1);
                pcVar6[uVar11 + iVar10] = __s[(uint)(iVar3 + iVar10)];
                if ((sVar5 <= uVar7) || (__s[uVar7] == ':')) break;
                iVar1 = iVar10 + 1;
              } while (__s[uVar7] != '/');
              uVar9 = (ulong)(iVar3 + iVar10 + 2);
              pcVar6[uVar11 + iVar10 + 1] = __s[uVar7];
              uVar11 = uVar11 + 2 + iVar10;
              uVar7 = (ulong)(uint)(iVar3 + 3 + iVar10);
              if (__s[uVar9] != ':') {
                uVar7 = uVar9;
              }
            }
          }
          uVar8 = (uint)uVar7;
          cVar2 = __s[uVar7];
          if (cVar2 != ':') goto LAB_001300f7;
          if (uVar11 == 0) {
            uVar11 = 0;
          }
          else if (pcVar6[uVar11 - 1] != '\0') {
            cVar2 = '\0';
            goto LAB_001300f7;
          }
        }
        uVar7 = (ulong)(uVar8 + 1);
      } while (uVar7 < sVar5);
    }
    if (uVar11 == 0) {
      uVar8 = 0;
    }
    else {
      uVar8 = uVar11 + 1;
      pcVar6[uVar11] = '\0';
    }
    pcVar6[uVar8] = '.';
    pcVar6[uVar8 + 1] = '/';
    pcVar6[uVar8 + 2] = '\0';
    pcVar6[uVar8 + 3] = '\0';
  }
  return pcVar6;
}

Assistant:

char *tokenise_search_path(char *searchpath) {
    char *newsearch;
    unsigned int i, j;
    size_t len;
#ifdef _WIN32
    char path_sep = ';';
#else
    char path_sep = ':';
#endif

    if (!searchpath)
	searchpath="";

    newsearch = (char *)malloc((len = strlen(searchpath))+5);
    if (!newsearch)
	return NULL;

    for (i = 0, j = 0; i < len; i++) {
	/* "::" => ":". Used for escaping colons in http://foo */
	if (i < len-1 && searchpath[i] == ':' && searchpath[i+1] == ':') {
	    newsearch[j++] = ':';
	    i++;
	    continue;
	}

	/* Handle http:// and ftp:// too without :: */
	if (path_sep == ':') {
	    if ((i == 0 || (i > 0 && searchpath[i-1] == ':')) &&
		(!strncmp(&searchpath[i], "http:",     5) ||
		 !strncmp(&searchpath[i], "ftp:",      4) ||
		 !strncmp(&searchpath[i], "|http:",    6) ||
		 !strncmp(&searchpath[i], "|ftp:",     5) ||
		 !strncmp(&searchpath[i], "URL=http:", 9) ||
		 !strncmp(&searchpath[i], "URL=ftp:",  8))) {
		do {
		    newsearch[j++] = searchpath[i];
		} while (i<len && searchpath[i++] != ':');
		if (searchpath[i] == ':')
		    i++;
		if (searchpath[i]=='/')
		    newsearch[j++] = searchpath[i++];
		if (searchpath[i]=='/')
		    newsearch[j++] = searchpath[i++];
		// Look for host:port
		do {
		    newsearch[j++] = searchpath[i++];
		} while (i<len && searchpath[i] != ':' && searchpath[i] != '/');
		newsearch[j++] = searchpath[i++];
		if (searchpath[i] == ':')
		    i++;
	    }
	}

	if (searchpath[i] == path_sep) {
	    /* Skip blank path components */
	    if (j && newsearch[j-1] != 0)
		newsearch[j++] = 0;
	} else {
	    newsearch[j++] = searchpath[i];
	}
    }

    if (j)
	newsearch[j++] = 0;
    newsearch[j++] = '.';
    newsearch[j++] = '/';
    newsearch[j++] = 0;
    newsearch[j++] = 0;
    
    return newsearch;
}